

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O0

HttpResponse<false> * __thiscall
uWS::HttpResponse<false>::writeHeader(HttpResponse<false> *this,string_view key,string_view value)

{
  string_view status;
  int __fd;
  const_pointer pvVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *in_stack_ffffffffffffff98;
  HttpResponse<false> *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff98);
  status._M_str = in_stack_ffffffffffffffc8;
  status._M_len = in_stack_ffffffffffffffc0;
  writeStatus(in_stack_ffffffffffffffb8,status);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_10);
  AsyncSocket<false>::write((AsyncSocket<false> *)in_RDI,(int)pvVar1,(void *)(sVar2 & 0xffffffff),0)
  ;
  AsyncSocket<false>::write((AsyncSocket<false> *)in_RDI,0x27e1c2,(void *)0x2,0);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
  __fd = (int)pvVar1;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_20);
  AsyncSocket<false>::write((AsyncSocket<false> *)in_RDI,__fd,(void *)(sVar2 & 0xffffffff),0);
  AsyncSocket<false>::write((AsyncSocket<false> *)in_RDI,0x27e1b1,(void *)0x2,0);
  return (HttpResponse<false> *)in_RDI;
}

Assistant:

HttpResponse *writeHeader(std::string_view key, std::string_view value) {
        writeStatus(HTTP_200_OK);

        Super::write(key.data(), (int) key.length());
        Super::write(": ", 2);
        Super::write(value.data(), (int) value.length());
        Super::write("\r\n", 2);
        return this;
    }